

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = (long)end - (long)ptr;
  if ((long)uVar7 < 2) {
    return -1;
  }
  bVar1 = ptr[1];
  iVar5 = 0;
  if (bVar1 - 0xd8 < 4) {
LAB_0034e729:
    pbVar4 = (byte *)ptr;
    iVar6 = iVar5;
    if (uVar7 < 4) {
      return -2;
    }
  }
  else {
    pbVar4 = (byte *)ptr;
    iVar6 = 0;
    if (bVar1 - 0xdc < 4) goto switchD_0034e6f2_caseD_13;
    if (bVar1 == 0) {
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if (cVar2 == '\x06') {
LAB_0034e736:
        pbVar4 = (byte *)ptr;
        iVar6 = iVar5;
        if (uVar7 == 2) {
          return -2;
        }
        goto switchD_0034e6f2_caseD_13;
      }
      if (cVar2 == '\a') goto LAB_0034e729;
      if (cVar2 == '\x13') {
        pbVar4 = (byte *)(ptr + 2);
        if ((long)end - (long)pbVar4 < 2) {
          return -1;
        }
        iVar6 = iVar5;
        if (ptr[3] == '\0') {
          if ((ulong)*pbVar4 == 0x78) {
            pbVar4 = (byte *)(ptr + 4);
            if ((long)end - (long)pbVar4 < 2) {
              return -1;
            }
            if ((ptr[5] == '\0') &&
               ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar4) & 0xfe) == 0x18)) {
              pbVar4 = (byte *)(ptr + 6);
              lVar8 = uVar7 - 6;
              while( true ) {
                if (lVar8 < 2) {
                  return -1;
                }
                if (pbVar4[1] != 0) goto switchD_0034e6f2_caseD_13;
                bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar4);
                if (1 < bVar1 - 0x18) break;
                pbVar4 = pbVar4 + 2;
                lVar8 = lVar8 + -2;
              }
              if (bVar1 == 0x12) {
                pbVar4 = pbVar4 + 2;
                iVar6 = 10;
              }
            }
          }
          else if (*(char *)((long)enc[1].scanners + (ulong)*pbVar4) == '\x19') {
            lVar8 = uVar7 - 4;
            pbVar3 = (byte *)(ptr + 4);
            do {
              pbVar4 = pbVar3;
              if (lVar8 < 2) {
                return -1;
              }
              if (pbVar4[1] != 0) goto switchD_0034e6f2_caseD_13;
              cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar4);
              lVar8 = lVar8 + -2;
              pbVar3 = pbVar4 + 2;
            } while (cVar2 == '\x19');
            if (cVar2 == '\x12') {
              pbVar4 = pbVar4 + 2;
              iVar6 = 10;
            }
          }
        }
        goto switchD_0034e6f2_caseD_13;
      }
      if ((cVar2 == '\x16') || (cVar2 == '\x18')) goto LAB_0034e651;
      iVar6 = iVar5;
      if (cVar2 != '\x1d') goto switchD_0034e6f2_caseD_13;
    }
    else if ((bVar1 == 0xff) && (iVar6 = iVar5, 0xfd < (byte)*ptr)) goto switchD_0034e6f2_caseD_13;
    iVar6 = iVar5;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         ((byte)*ptr & 0x1f) & 1) != 0) {
LAB_0034e651:
      ptr = ptr + 2;
      while( true ) {
        uVar7 = uVar7 - 2;
        if ((long)uVar7 < 2) {
          return -1;
        }
        bVar1 = ((byte *)ptr)[1];
        pbVar4 = (byte *)ptr;
        if (bVar1 == 0) break;
        if (bVar1 == 0xff) {
          iVar6 = iVar5;
          if (0xfd < (byte)*ptr) goto switchD_0034e6f2_caseD_13;
        }
        else {
          if (bVar1 - 0xd8 < 4) goto LAB_0034e729;
          iVar6 = iVar5;
          if (bVar1 - 0xdc < 4) goto switchD_0034e6f2_caseD_13;
        }
switchD_0034e6f2_caseD_1d:
        iVar6 = iVar5;
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)*ptr >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_0034e6f2_caseD_13;
switchD_0034e6f2_caseD_16:
        ptr = (char *)((byte *)ptr + 2);
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      iVar6 = iVar5;
      switch(cVar2) {
      case '\x12':
        pbVar4 = (byte *)ptr + 2;
        iVar6 = 9;
      case '\x13':
      case '\x14':
      case '\x15':
      case '\x17':
      case '\x1c':
        break;
      case '\x16':
      case '\x18':
      case '\x19':
      case '\x1a':
      case '\x1b':
        goto switchD_0034e6f2_caseD_16;
      case '\x1d':
        goto switchD_0034e6f2_caseD_1d;
      default:
        if (cVar2 == '\x06') goto LAB_0034e736;
        if (cVar2 != '\a') break;
        goto LAB_0034e729;
      }
    }
  }
switchD_0034e6f2_caseD_13:
  *nextTokPtr = (char *)pbVar4;
  return iVar6;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}